

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall
kratos::PipelineInsertionVisitor::visit(PipelineInsertionVisitor *this,Generator *generator)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  undefined8 *puVar2;
  element_type *peVar3;
  pointer __nptr;
  SequentialStmtBlock *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  shared_ptr<kratos::Var> *var;
  StmtBlock *this_02;
  element_type *this_03;
  pointer pbVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  Var *pVVar8;
  _Base_ptr p_Var9;
  GeneratorException *this_04;
  undefined8 uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar11 [8];
  long lVar12;
  undefined8 uVar13;
  bool bVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__new_size;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_198 [8];
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  attributes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  undefined1 local_140 [8];
  shared_ptr<kratos::Port> clock_port;
  size_type *local_120;
  string clock_name;
  undefined1 auStack_f8 [8];
  vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
  blocks;
  undefined1 local_d8 [8];
  shared_ptr<kratos::Port> port;
  pointer ppStack_c0;
  undefined1 auStack_b8 [8];
  vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> vars;
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clock_names;
  
  local_120 = &clock_name._M_string_length;
  clock_name._M_dataplus._M_p = (pointer)0x0;
  clock_name._M_string_length._0_1_ = 0;
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
          *)local_198,&(generator->super_IRNode).attributes_);
  local_78.field_2._8_8_ = generator;
  if (local_198 ==
      (undefined1  [8])
      attributes.
      super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __new_size = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar14 = false;
  }
  else {
    bVar14 = false;
    __new_size = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auVar11 = local_198;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&((((pointer)auVar11)->
                                   super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->type_str);
      peVar3 = (((pointer)auVar11)->
               super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (iVar5 == 0) {
        __nptr = (pointer)(peVar3->value_str)._M_dataplus._M_p;
        piVar6 = __errno_location();
        iVar5 = *piVar6;
        *piVar6 = 0;
        uVar7 = strtol((char *)__nptr,
                       (char **)&attributes.
                                 super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,10);
        if (attributes.
            super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == __nptr) {
          std::__throw_invalid_argument("stoi");
LAB_003d355a:
          std::__throw_out_of_range("stoi");
        }
        if (((long)(int)uVar7 != uVar7) || (*piVar6 == 0x22)) goto LAB_003d355a;
        if (*piVar6 == 0) {
          *piVar6 = iVar5;
        }
        if (0 < (int)uVar7) {
          __new_size = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(uVar7 & 0xffffffff);
          bVar14 = true;
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&peVar3->type_str);
        if (iVar5 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_120);
        }
      }
      auVar11 = (undefined1  [8])((long)auVar11 + 0x10);
    } while (auVar11 !=
             (undefined1  [8])
             attributes.
             super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar10 = local_78.field_2._8_8_;
  if (bVar14) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&attributes.
                   super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_78.field_2._8_8_ + 0x130));
    if (clock_name._M_dataplus._M_p == (pointer)0x0) {
      Generator::get_ports_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_58,(Generator *)uVar10,Clock);
      if (auStack_58 !=
          (undefined1  [8])
          clock_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::_M_assign((string *)&local_120);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_58);
    }
    if (clock_name._M_dataplus._M_p == (pointer)0x0) {
      this_04 = (GeneratorException *)__cxa_allocate_exception(0x10);
      local_88._0_8_ = (((string *)(uVar10 + 0x78))->_M_dataplus)._M_p;
      local_88._8_8_ = *(size_type *)(uVar10 + 0x80);
      format_str_00.size_ = 0xd;
      format_str_00.data_ = (char *)0x2d;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_88;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)auStack_58,(detail *)"Unable to find clock signal for generator {0}",
                 format_str_00,args_00);
      auStack_f8 = (undefined1  [8])local_78.field_2._8_8_;
      __l._M_len = 1;
      __l._M_array = (iterator)auStack_f8;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_88,__l,
                 (allocator_type *)auStack_b8);
      GeneratorException::GeneratorException
                (this_04,(string *)auStack_58,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)local_88);
      __cxa_throw(this_04,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
    }
    Generator::get_port((Generator *)local_140,(string *)uVar10);
    auStack_f8 = (undefined1  [8])0x0;
    blocks.
    super__Vector_base<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    blocks.
    super__Vector_base<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ::resize((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
              *)auStack_f8,(size_type)__new_size);
    clock_name.field_2._8_8_ = __new_size;
    if ((int)__new_size != 0) {
      lVar12 = 0;
      do {
        auStack_58 = (undefined1  [8])0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<kratos::SequentialStmtBlock,std::allocator<kratos::SequentialStmtBlock>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clock_names,
                   (SequentialStmtBlock **)auStack_58,
                   (allocator<kratos::SequentialStmtBlock> *)local_88);
        std::__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<kratos::SequentialStmtBlock,kratos::SequentialStmtBlock>
                  ((__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2> *)
                   auStack_58,(SequentialStmtBlock *)auStack_58);
        pbVar4 = clock_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        auVar11 = auStack_58;
        auStack_58 = (undefined1  [8])0x0;
        clock_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)((long)auStack_f8 + 8))->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar12);
        puVar2 = (undefined8 *)
                 ((long)&((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                         auStack_f8)->_M_ptr + lVar12);
        *puVar2 = auVar11;
        puVar2[1] = pbVar4;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        if (clock_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     clock_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                      auStack_f8)->_M_ptr + lVar12);
        p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)((long)auStack_f8 + 8))->
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + lVar12);
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        Generator::add_stmt((Generator *)uVar10,
                            (shared_ptr<kratos::Stmt> *)
                            &clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        this_00 = *(SequentialStmtBlock **)
                   ((long)&((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *
                            )auStack_f8)->_M_ptr + lVar12);
        auStack_58 = (undefined1  [8])((ulong)auStack_58 & 0xffffffff00000000);
        clock_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_140;
        clock_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if (clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar1 = &((clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Var).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar1 = &((clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_Var).super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        SequentialStmtBlock::add_condition
                  (this_00,(pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_58)
        ;
        if (clock_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     clock_names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (*(bool *)(uVar10 + 0xbc) == true) {
          auStack_58 = (undefined1  [8])0x413c8e;
          clock_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(clock_names.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,0x242);
          std::
          vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
          ::emplace_back<std::pair<char_const*,int>>
                    ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                      *)(*(long *)((long)&((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                            *)auStack_f8)->_M_ptr + lVar12) + 8),
                     (pair<const_char_*,_int> *)auStack_58);
        }
        lVar12 = lVar12 + 0x10;
      } while ((long)__new_size << 4 != lVar12);
    }
    if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&port_names)
    {
      uVar7 = (ulong)((int)clock_name.field_2._8_8_ - 1);
      uVar13 = clock_name.field_2._8_8_;
      p_Var9 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        Generator::get_port((Generator *)local_d8,(string *)uVar10);
        if (*(int *)&(((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                        *)((long)local_d8 + 0x260))->_M_h)._M_before_begin._M_nxt != 0) {
          auStack_b8 = (undefined1  [8])0x0;
          vars.
          super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vars.
          super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var9;
          std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
          ::resize((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                    *)auStack_b8,(size_type)__new_size);
          if ((int)uVar13 != 0) {
            lVar12 = 8;
            p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            do {
              format_str.size_ = 2;
              format_str.data_ = (char *)0x9;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.args_ = in_R9.args_;
              args.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = (unsigned_long_long)
                       &port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   p_Var15;
              fmt::v7::detail::vformat_abi_cxx11_
                        ((string *)local_88,(detail *)"stage_{0}",format_str,args);
              Generator::get_unique_variable_name
                        ((string *)auStack_58,(Generator *)local_78.field_2._8_8_,
                         (string *)(p_Var9 + 1),(string *)local_88);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_88._0_8_ != &local_78) {
                operator_delete((void *)local_88._0_8_,(ulong)((long)local_78._M_dataplus._M_p + 1))
                ;
              }
              uVar10 = local_78.field_2._8_8_;
              pVVar8 = Generator::var((Generator *)local_78.field_2._8_8_,(string *)auStack_58,
                                      *(uint32_t *)
                                       &(((string *)((long)local_d8 + 0x98))->_M_dataplus)._M_p,
                                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                      &((string *)((long)local_d8 + 0x98))->_M_string_length,
                                      *(bool *)&(((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)((long)local_d8 + 0xe0))->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_end_of_storage)
              ;
              if (*(bool *)(uVar10 + 0xbc) == true) {
                local_88._0_8_ =
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                ;
                local_88._8_4_ = 0x252;
                std::
                vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                ::emplace_back<std::pair<char_const*,int>>
                          ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                            *)&(pVVar8->super_IRNode).fn_name_ln,(pair<const_char_*,_int> *)local_88
                          );
              }
              std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<kratos::Var,void>
                        ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_88,
                         (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                         &pVVar8->super_enable_shared_from_this<kratos::Var>);
              uVar13 = local_88._8_8_;
              uVar10 = local_88._0_8_;
              local_88._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_88._8_8_ = (pointer)0x0;
              this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)auStack_b8 + lVar12);
              puVar2 = (undefined8 *)((long)((long)auStack_b8 - 8U) + lVar12);
              *puVar2 = uVar10;
              puVar2[1] = uVar13;
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
              }
              if ((pointer)local_88._8_8_ != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
              }
              if (auStack_58 !=
                  (undefined1  [8])
                  &clock_names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_58,
                                (ulong)((long)&((clock_names.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish)->
                                               _M_dataplus)._M_p + 1));
              }
              p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&p_Var15->_vptr__Sp_counted_base + 1);
              lVar12 = lVar12 + 0x10;
            } while (__new_size != p_Var15);
          }
          Var::move_src_to((Var *)local_d8,*(Var **)auStack_b8,(Generator *)local_78.field_2._8_8_,
                           false);
          uVar13 = clock_name.field_2._8_8_;
          p_Var9 = (_Base_ptr)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (uVar7 != 0) {
            lVar12 = 0;
            do {
              auStack_58 = *(undefined1 (*) [8])((long)auStack_b8 + lVar12);
              clock_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   *(pointer *)((long)((long)auStack_b8 + 8U) + lVar12);
              if (clock_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&(clock_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length =
                       (int)(clock_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&(clock_names.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length =
                       (int)(clock_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + 1;
                }
              }
              var = *(shared_ptr<kratos::Var> **)((long)((long)auStack_b8 + 0x10U) + lVar12);
              p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)((long)auStack_b8 + 0x18U) + lVar12);
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                }
              }
              this_02 = *(StmtBlock **)
                         ((long)&((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                   *)auStack_f8)->_M_ptr + lVar12);
              Var::assign((Var *)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,var,(AssignmentType)auStack_58);
              local_88._0_8_ =
                   port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
              local_88._8_8_ = ppStack_c0;
              port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ppStack_c0 = (pointer)0x0;
              StmtBlock::add_stmt(this_02,(shared_ptr<kratos::Stmt> *)local_88);
              if ((pointer)local_88._8_8_ != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
              }
              if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
              }
              if (clock_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           clock_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar12 = lVar12 + 0x10;
            } while (uVar7 * 0x10 != lVar12);
          }
          this_03 = ((__shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                    auStack_f8)[uVar7]._M_ptr;
          Var::assign((Var *)local_88,(shared_ptr<kratos::Var> *)local_d8,
                      auStack_b8._0_4_ + (int)(uVar7 * 0x10));
          auStack_58 = (undefined1  [8])local_88._0_8_;
          clock_names.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._8_8_;
          local_88._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_88._8_8_ = (pointer)0x0;
          StmtBlock::add_stmt(&this_03->super_StmtBlock,(shared_ptr<kratos::Stmt> *)auStack_58);
          if (clock_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       clock_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar10 = local_78.field_2._8_8_;
          if ((pointer)local_88._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
          }
          std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
          ::~vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                     *)auStack_b8);
        }
        if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != (_Rb_tree_node_base *)&port_names);
    }
    std::
    vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ::~vector((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
               *)auStack_f8);
    if (clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&attributes.
                    super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           *)local_198);
  if (local_120 != &clock_name._M_string_length) {
    operator_delete(local_120,
                    CONCAT71(clock_name._M_string_length._1_7_,
                             (undefined1)clock_name._M_string_length) + 1);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        // only if the generator has attribute of "pipeline" and the value string is the
        // number of pipeline stages will do
        bool has_attribute = false;
        std::string clock_name;
        auto attributes = generator->get_attributes();
        uint32_t num_stages = 0;
        for (auto const& attr : attributes) {
            if (attr->type_str == "pipeline") {
                try {
                    int i = std::stoi(attr->value_str);
                    if (i > 0) {
                        num_stages = static_cast<uint32_t>(i);
                        has_attribute = true;
                    }
                } catch (std::invalid_argument const&) {
                    throw std::runtime_error(
                        ::format("Unable to get value string from generator {0}", generator->name));
                }
            } else if (attr->type_str == "pipeline_clk") {
                clock_name = attr->value_str;
            }
        }
        if (has_attribute) {
            auto port_names = generator->get_port_names();
            // get the clock name, if it's empty
            if (clock_name.empty()) {
                // pick the first one
                auto clock_names = generator->get_ports(PortType::Clock);
                if (!clock_names.empty()) clock_name = clock_names[0];
            }
            if (clock_name.empty()) {
                throw GeneratorException(
                    ::format("Unable to find clock signal for generator {0}", generator->name),
                    {generator});
            }
            auto clock_port = generator->get_port(clock_name);
            // we need to create all the registers based on the posedge of the clock
            std::vector<std::shared_ptr<SequentialStmtBlock>> blocks;
            blocks.resize(num_stages);
            for (uint32_t i = 0; i < num_stages; i++) {
                blocks[i] = std::make_shared<SequentialStmtBlock>();
                generator->add_stmt(blocks[i]);
                blocks[i]->add_condition({EventEdgeType::Posedge, clock_port});
                if (generator->debug)
                    blocks[i]->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // get all the outputs
            for (auto const& port_name : port_names) {
                auto port = generator->get_port(port_name);
                if (port->port_direction() == PortDirection::In) {
                    continue;
                }
                std::vector<std::shared_ptr<Var>> vars;
                vars.resize(num_stages);
                for (uint32_t i = 0; i < num_stages; i++) {
                    auto new_name =
                        generator->get_unique_variable_name(port_name, ::format("stage_{0}", i));
                    auto& var = generator->var(new_name, port->var_width(), port->size(),
                                               port->is_signed());
                    if (generator->debug)
                        var.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
                    vars[i] = var.shared_from_this();
                }
                // move the source to the first stage
                Var::move_src_to(port.get(), vars[0].get(), generator, false);
                // connect the stages together
                for (uint32_t i = 0; i < num_stages - 1; i++) {
                    auto pre_stage = vars[i];
                    auto next_stage = vars[i + 1];
                    blocks[i]->add_stmt(next_stage->assign(pre_stage, AssignmentType::NonBlocking));
                }
                // last stage
                blocks[num_stages - 1]->add_stmt(
                    port->assign(vars[num_stages - 1], AssignmentType::NonBlocking));
            }
        }
    }